

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O2

Mat_<double> * mel_to_hz(Mat_<double> *__return_storage_ptr__,Mat_<double> *mels,bool htk)

{
  int i;
  long lVar1;
  double dVar2;
  Mat_<bool> log_t;
  Scalar_<double> SStack_2f8;
  Mat_<bool> local_2d8 [3];
  MatExpr local_178 [352];
  
  cv::operator*(&local_2d8[0].super_Mat,66.66666666666667);
  cv::Scalar_<double>::Scalar_(&SStack_2f8,0.0);
  cv::operator+(local_178,(Scalar_ *)local_2d8);
  cv::Mat_<double>::Mat_(__return_storage_ptr__,local_178);
  cv::MatExpr::~MatExpr(local_178);
  cv::MatExpr::~MatExpr((MatExpr *)local_2d8);
  cv::operator>=((Mat *)local_178,14.999999999999998);
  cv::Mat_<bool>::Mat_(local_2d8,local_178);
  cv::MatExpr::~MatExpr(local_178);
  for (lVar1 = 0; lVar1 < (int)local_2d8[0]._12_4_; lVar1 = lVar1 + 1) {
    if (*(char *)(local_2d8[0]._16_8_ + lVar1) == '\x01') {
      dVar2 = exp((*(double *)(*(long *)&mels->field_0x10 + lVar1 * 8) + -14.999999999999998) *
                  0.06875177742094912);
      *(double *)(*(long *)&__return_storage_ptr__->field_0x10 + lVar1 * 8) = dVar2 * 1000.0;
    }
  }
  cv::Mat::~Mat(&local_2d8[0].super_Mat);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> mel_to_hz(cv::Mat_<double> mels, bool htk = false) {
//    if (htk) {
//        return //python://700.0 * (10.0**(mels / 2595.0) - 1.0);
//    }
    // Fill in the linear scale
    double f_min = 0.0;
    double f_sp = 200.0 / 3;
    cv::Mat_<double> freqs = mels * f_sp + f_min;
    // And now the nonlinear scale
    double min_log_hz = 1000.0;                         // beginning of log region (Hz)
    double min_log_mel = (min_log_hz - f_min) / f_sp;   // same (Mels)
    double logstep = log(6.4) / 27.0;              // step size for log region
    // 对照Python平台的librosa库，移植
    //if (mels.ndim) {
    // If we have vector data, vectorize
    cv::Mat_<bool> log_t = (mels >= min_log_mel);
    for (int i = 0; i < log_t.cols; i++) {
        if (log_t(0, i)) {
            freqs(0, i) = cv::exp((mels(0, i) - min_log_mel) * logstep) * min_log_hz;
        }
    }
    //}
    return freqs;
}